

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::SingleRange,int_const(&)[3]>,double,double>
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst,
               IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
               *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index ncols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
  *src_local;
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst_local;
  
  IVar1 = IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
          ::rows(src);
  ncols = IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
          ::cols(src);
  IVar2 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::rows(dst);
  if (IVar2 == IVar1) {
    IVar2 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::cols(dst);
    if (IVar2 == ncols) goto LAB_001748fd;
  }
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::resize(dst,IVar1,ncols);
LAB_001748fd:
  IVar2 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::rows(dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::cols(dst);
    bVar3 = IVar1 == ncols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::IndexedView<Eigen::Matrix<double, -1, -1>, Eigen::internal::SingleRange, const int (&)[3]>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}